

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O3

Matrix44<double> * __thiscall
Imath_2_5::Euler<double>::toMatrix44(Matrix44<double> *__return_storage_ptr__,Euler<double> *this)

{
  undefined8 uVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  double local_78;
  undefined8 local_68;
  double local_58;
  
  bVar2 = this->field_0x18;
  bVar11 = bVar2 >> 3;
  uVar17 = bVar11 & 3;
  if ((bVar2 & 4) == 0) {
    iVar16 = 2;
    if ((bVar11 & 3) != 0) {
      iVar16 = uVar17 - 1;
    }
    uVar15 = (uVar17 + (uint)((byte)uVar17 < 2) * 3) - 2;
  }
  else {
    iVar16 = uVar17 + (uint)((byte)uVar17 < 2) * 3 + -2;
    uVar15 = 2;
    if ((bVar11 & 3) != 0) {
      uVar15 = uVar17 - 1;
    }
  }
  local_58 = *(double *)((long)&(this->super_Vec3<double>).x + (ulong)((bVar2 & 1) << 4));
  local_78 = (this->super_Vec3<double>).y;
  uVar1 = *(undefined8 *)((long)&(this->super_Vec3<double>).x + (ulong)(((byte)~bVar2 & 1) << 4));
  uVar19 = (undefined4)uVar1;
  uVar12 = (uint)((ulong)uVar1 >> 0x20);
  if ((bVar2 & 4) == 0) {
    uVar12 = uVar12 ^ 0x80000000;
    local_78 = -local_78;
    local_58 = -local_58;
  }
  local_68 = (double)CONCAT44(uVar12,uVar19);
  dVar3 = cos((double)CONCAT44(uVar12,uVar19));
  dVar4 = cos(local_78);
  dVar5 = cos(local_58);
  dVar6 = sin(local_68);
  dVar7 = sin(local_78);
  dVar8 = sin(local_58);
  dVar9 = dVar3 * dVar5;
  dVar20 = dVar3 * dVar8;
  dVar10 = dVar5 * dVar6;
  dVar21 = dVar6 * dVar8;
  __return_storage_ptr__->x[1][1] = 0.0;
  __return_storage_ptr__->x[1][2] = 0.0;
  __return_storage_ptr__->x[2][1] = 0.0;
  __return_storage_ptr__->x[2][2] = 0.0;
  __return_storage_ptr__->x[0][1] = 0.0;
  __return_storage_ptr__->x[0][2] = 0.0;
  __return_storage_ptr__->x[0][3] = 0.0;
  __return_storage_ptr__->x[1][0] = 0.0;
  __return_storage_ptr__->x[1][3] = 0.0;
  __return_storage_ptr__->x[2][0] = 0.0;
  __return_storage_ptr__->x[2][3] = 0.0;
  __return_storage_ptr__->x[3][0] = 0.0;
  __return_storage_ptr__->x[3][1] = 0.0;
  __return_storage_ptr__->x[3][2] = 0.0;
  __return_storage_ptr__->x[0][0] = 1.0;
  __return_storage_ptr__->x[1][1] = 1.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  if ((this->field_0x18 & 2) == 0) {
    uVar12 = uVar17 << 5;
    uVar18 = (ulong)(uVar17 << 3);
    *(double *)((long)__return_storage_ptr__->x[0] + uVar18 + uVar12) = dVar5 * dVar4;
    lVar13 = (long)iVar16;
    *(double *)((long)__return_storage_ptr__->x[lVar13] + uVar18) = dVar7 * dVar10 - dVar20;
    uVar14 = (ulong)uVar15;
    *(double *)((long)__return_storage_ptr__->x[uVar14] + uVar18) = dVar7 * dVar9 + dVar21;
    *(double *)((long)__return_storage_ptr__->x[0] + lVar13 * 8 + (ulong)uVar12) = dVar8 * dVar4;
    *(double *)((long)__return_storage_ptr__->x + lVar13 * 0x28) = dVar21 * dVar7 + dVar9;
    __return_storage_ptr__->x[uVar14][lVar13] = dVar7 * dVar20 - dVar10;
    *(double *)((long)__return_storage_ptr__->x[0] + uVar14 * 8 + (ulong)uVar12) = -dVar7;
    __return_storage_ptr__->x[lVar13][uVar14] = dVar6 * dVar4;
    *(double *)((long)__return_storage_ptr__->x + uVar14 * 0x28) = dVar3 * dVar4;
  }
  else {
    uVar12 = uVar17 << 5;
    uVar18 = (ulong)(uVar17 << 3);
    *(double *)((long)__return_storage_ptr__->x[0] + uVar18 + uVar12) = dVar4;
    lVar13 = (long)iVar16;
    *(double *)((long)__return_storage_ptr__->x[lVar13] + uVar18) = dVar6 * dVar7;
    uVar14 = (ulong)uVar15;
    *(double *)((long)__return_storage_ptr__->x[uVar14] + uVar18) = dVar3 * dVar7;
    *(double *)((long)__return_storage_ptr__->x[0] + lVar13 * 8 + (ulong)uVar12) = dVar8 * dVar7;
    *(double *)((long)__return_storage_ptr__->x + lVar13 * 0x28) = dVar9 - dVar4 * dVar21;
    __return_storage_ptr__->x[uVar14][lVar13] = -dVar4 * dVar20 - dVar10;
    *(double *)((long)__return_storage_ptr__->x[0] + uVar14 * 8 + (ulong)uVar12) = dVar5 * -dVar7;
    __return_storage_ptr__->x[lVar13][uVar14] = dVar10 * dVar4 + dVar20;
    *(double *)((long)__return_storage_ptr__->x + uVar14 * 0x28) = dVar4 * dVar9 - dVar21;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix44<T> Euler<T>::toMatrix44() const
{
    int i,j,k;
    angleOrder(i,j,k);

    Vec3<T> angles;

    if ( _frameStatic ) angles = (*this);
    else angles = Vec3<T>(z,y,x);

    if ( !_parityEven ) angles *= -1.0;

    T ci = Math<T>::cos(angles.x);
    T cj = Math<T>::cos(angles.y);
    T ch = Math<T>::cos(angles.z);
    T si = Math<T>::sin(angles.x);
    T sj = Math<T>::sin(angles.y);
    T sh = Math<T>::sin(angles.z);

    T cc = ci*ch;
    T cs = ci*sh;
    T sc = si*ch;
    T ss = si*sh;

    Matrix44<T> M;

    if ( _initialRepeated )
    {
	M[i][i] = cj;	  M[j][i] =  sj*si;    M[k][i] =  sj*ci;
	M[i][j] = sj*sh;  M[j][j] = -cj*ss+cc; M[k][j] = -cj*cs-sc;
	M[i][k] = -sj*ch; M[j][k] =  cj*sc+cs; M[k][k] =  cj*cc-ss;
    }
    else
    {
	M[i][i] = cj*ch; M[j][i] = sj*sc-cs; M[k][i] = sj*cc+ss;
	M[i][j] = cj*sh; M[j][j] = sj*ss+cc; M[k][j] = sj*cs-sc;
	M[i][k] = -sj;	 M[j][k] = cj*si;    M[k][k] = cj*ci;
    }

    return M;
}